

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O3

void __thiscall cmInstallExportGenerator::ComputeTempDir(cmInstallExportGenerator *this)

{
  string *input;
  string *psVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  pointer pcVar5;
  char *__s;
  string dest;
  string local_40;
  
  __s = cmMakefile::GetCurrentBinaryDirectory(this->Makefile);
  psVar1 = &this->TempDir;
  pcVar2 = (char *)(this->TempDir)._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar2,(ulong)__s);
  std::__cxx11::string::append((char *)psVar1);
  std::__cxx11::string::append((char *)psVar1);
  if ((this->super_cmInstallGenerator).Destination._M_string_length != 0) {
    input = &(this->super_cmInstallGenerator).Destination;
    std::__cxx11::string::append((char *)psVar1);
    uVar3 = (this->TempDir)._M_string_length;
    if ((uVar3 < 1000) &&
       (uVar4 = (this->super_cmInstallGenerator).Destination._M_string_length, uVar4 <= 1000 - uVar3
       )) {
      pcVar5 = (input->_M_dataplus)._M_p;
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_40,pcVar5,pcVar5 + uVar4);
      if (*local_40._M_dataplus._M_p == '/') {
        *local_40._M_dataplus._M_p = '_';
      }
      cmsys::SystemTools::ReplaceString(&local_40,":","_");
      cmsys::SystemTools::ReplaceString(&local_40,"../","__/");
      cmsys::SystemTools::ReplaceString(&local_40," ","_");
      std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_40._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p == &local_40.field_2) {
        return;
      }
    }
    else {
      cmSystemTools::ComputeStringMD5(&local_40,input);
      std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_40._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p == &local_40.field_2) {
        return;
      }
    }
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmInstallExportGenerator::ComputeTempDir()
{
  // Choose a temporary directory in which to generate the import
  // files to be installed.
  this->TempDir = this->Makefile->GetCurrentBinaryDirectory();
  this->TempDir += cmake::GetCMakeFilesDirectory();
  this->TempDir += "/Export";
  if(this->Destination.empty())
    {
    return;
    }
  else
    {
    this->TempDir += "/";
    }

  // Enforce a maximum length.
  bool useMD5 = false;
#if defined(_WIN32) || defined(__CYGWIN__)
  std::string::size_type const max_total_len = 250;
#else
  std::string::size_type const max_total_len = 1000;
#endif
  if(this->TempDir.size() < max_total_len)
    {
    // Keep the total path length below the limit.
    std::string::size_type max_len = max_total_len - this->TempDir.size();
    if(this->Destination.size() > max_len)
      {
      useMD5 = true;
      }
    }
  else
    {
    useMD5 = true;
    }
  if(useMD5)
    {
    // Replace the destination path with a hash to keep it short.
    this->TempDir +=
      cmSystemTools::ComputeStringMD5(this->Destination);
    }
  else
    {
    std::string dest = this->Destination;
    // Avoid unix full paths.
    if(dest[0] == '/')
      {
      dest[0] = '_';
      }
    // Avoid windows full paths by removing colons.
    cmSystemTools::ReplaceString(dest, ":", "_");
    // Avoid relative paths that go up the tree.
    cmSystemTools::ReplaceString(dest, "../", "__/");
    // Avoid spaces.
    cmSystemTools::ReplaceString(dest, " ", "_");
    this->TempDir += dest;
    }
}